

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

void __thiscall LLVMBC::StreamState::append(StreamState *this,GlobalVariable *var,bool decl)

{
  bool bVar1;
  TypeID TVar2;
  uint uVar3;
  Type *pTVar4;
  Constant *value;
  LoggingCallback p_Var5;
  void *pvVar6;
  undefined7 in_register_00000011;
  char *local_1018;
  undefined5 uStack_1010;
  undefined3 uStack_100b;
  undefined5 uStack_1008;
  char acStack_1003 [4075];
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_1018 = (char *)Value::get_tween_id((Value *)var);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1c4917,(unsigned_long *)&local_1018)
    ;
  }
  else {
    local_1018 = (char *)Value::get_tween_id((Value *)var);
    append<char_const(&)[2],unsigned_long,char_const(&)[4]>
              (this,(char (*) [2])0x1c4917,(unsigned_long *)&local_1018,(char (*) [4])" = ");
    pTVar4 = Value::getType((Value *)var);
    TVar2 = Type::getTypeID(pTVar4);
    if (TVar2 != PointerTyID) {
      p_Var5 = ::dxil_spv::get_thread_log_callback();
      if (p_Var5 == (LoggingCallback)0x0) {
        append();
        std::terminate();
      }
      uStack_1008 = 0x6163206e69;
      builtin_strncpy(acStack_1003,"st<T>.\n",8);
      local_1018 = (char *)0x2064696c61766e49;
      uStack_1010 = 0x2065707974;
      uStack_100b = 0x204449;
      pvVar6 = ::dxil_spv::get_thread_log_callback_userdata();
      (*p_Var5)(pvVar6,Error,(char *)&local_1018);
      std::terminate();
    }
    uVar3 = Type::getAddressSpace(pTVar4);
    if (uVar3 == 0) {
      bVar1 = GlobalVariable::isConstant(var);
      local_1018 = "global";
      if (bVar1) {
        local_1018 = "constant";
      }
      append<char_const*,char_const(&)[2]>(this,&local_1018,(char (*) [2])0x1c47f6);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"groupshared ",0xc);
    }
    pTVar4 = Value::getType((Value *)var);
    pTVar4 = Type::getPointerElementType(pTVar4);
    append(this,pTVar4);
    bVar1 = GlobalVariable::hasInitializer(var);
    if (bVar1) {
      value = GlobalVariable::getInitializer(var);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
      append(this,&value->super_Value,false);
    }
    newline(this);
  }
  return;
}

Assistant:

void StreamState::append(GlobalVariable *var, bool decl)
{
	if (decl)
	{
		append("@", var->get_tween_id(), " = ");

		if (cast<PointerType>(var->getType())->getAddressSpace() != 0)
			append("groupshared ");
		else
			append(var->isConstant() ? "constant" : "global", " ");
		append(var->getType()->getPointerElementType());

		if (var->hasInitializer())
			append(" ", var->getInitializer());
		newline();
	}
	else
	{
		append("@", var->get_tween_id());
	}
}